

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryStats.cpp
# Opt level: O2

void DictionaryStats::OutputStats(void)

{
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined1 auVar1 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  DictionaryStats *pDVar11;
  DictionaryType *type;
  DictionaryType *pDVar12;
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  double dVar17;
  undefined1 auVar16 [16];
  double dVar18;
  undefined1 in_XMM1 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  double dVar21;
  double dVar22;
  undefined1 auVar23 [16];
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  undefined1 auVar29 [16];
  double dVar33;
  double dVar34;
  double dVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  undefined8 uVar38;
  undefined8 uVar39;
  double dVar40;
  undefined1 in_XMM11 [16];
  undefined1 auVar41 [16];
  double dVar43;
  undefined1 auVar42 [16];
  undefined8 uVar44;
  double dVar45;
  double dVar46;
  undefined1 local_78 [16];
  double local_68;
  double local_40;
  double local_38;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  
  if (dictionaryTypes == (DictionaryType *)0x0) {
    return;
  }
  CCLock::Enter(&dictionaryTypesCriticalSection.super_CCLock);
  pDVar12 = dictionaryTypes;
  Output::Print(L"PROFILE DICTIONARY\n");
  Output::Print(L"%8s  %13s  %13s  %13s  %13s  %13s  %13s  %13s  %14s  %14s  %13s  %13s  %13s    %s\n"
                ,L"Metric",L"StartSize",L"EndSize",L"Resizes",L"Items",L"MaxDepth",L"EmptyBuckets",
                L"Lookups",L"Collisions",L"AvgLookupDepth",L"AvgCollDepth",L"MaxLookupDepth",
                L"Instances",L"Type");
  for (; pDVar12 != (DictionaryType *)0x0; pDVar12 = pDVar12->pNext) {
    pDVar11 = (DictionaryStats *)&pDVar12->instances;
    local_78 = ZEXT816(0);
    local_68 = 0.0;
    local_40 = 0.0;
    local_38 = 0.0;
    dVar46 = 0.0;
    uVar36 = 0;
    uVar37 = 0;
    uVar38 = 0;
    uVar39 = 0;
    uVar44 = 0;
    dVar45 = 0.0;
    dVar34 = 0.0;
    dVar35 = 0.0;
    dVar26 = 0.0;
    dVar27 = 0.0;
    dVar21 = 0.0;
    dVar22 = 0.0;
    dVar24 = 0.0;
    dVar25 = 0.0;
    while (pDVar11 = pDVar11->pNext, pDVar11 != (DictionaryStats *)0x0) {
      auVar19._0_4_ = pDVar11->itemCount;
      uVar2 = pDVar11->maxDepth;
      uVar3 = pDVar11->lookupCount;
      uVar4 = pDVar11->collisionCount;
      auVar19._12_4_ = uVar4;
      auVar19._8_4_ = uVar3;
      auVar19._4_4_ = uVar2;
      auVar29._4_12_ = auVar19._4_12_;
      auVar29._0_4_ = uVar3;
      auVar31._0_8_ = auVar29._0_8_;
      auVar31._8_4_ = uVar4;
      auVar31._12_4_ = uVar4;
      auVar30._8_8_ = auVar31._8_8_;
      auVar30._4_4_ = 0;
      auVar30._0_4_ = uVar3;
      auVar32._0_12_ = auVar30._0_12_;
      auVar32._12_4_ = 0;
      auVar41._8_8_ = 0x4330000000000000;
      auVar41._0_8_ = 0x4330000000000000;
      dVar28 = SUB168(auVar32 | auVar41,0) - 4503599627370496.0;
      dVar33 = SUB168(auVar32 | auVar41,8) - 4503599627370496.0;
      if (pDVar11->lookupCount != 0) {
        dVar13 = (double)pDVar11->lookupDepthTotal / dVar28;
        in_XMM1._0_8_ = local_68 + dVar13;
        in_XMM1._8_8_ = 0;
        local_68 = in_XMM1._0_8_;
        if (local_40 < dVar13) {
          local_40 = dVar13;
        }
      }
      auVar1._0_4_ = pDVar11->initialSize;
      auVar1._4_4_ = pDVar11->finalSize;
      auVar1._8_4_ = pDVar11->countOfEmptyBuckets;
      auVar1._12_4_ = pDVar11->countOfResize;
      auVar41 = pmovzxdq(in_XMM11,auVar1);
      auVar8._8_8_ = 0x4330000000000000;
      auVar8._0_8_ = 0x4330000000000000;
      dVar40 = SUB168(auVar41 | auVar8,0) - 4503599627370496.0;
      dVar43 = SUB168(auVar41 | auVar8,8) - 4503599627370496.0;
      auVar19 = pmovzxdq(in_XMM1,auVar19);
      auVar9._8_8_ = 0x4330000000000000;
      auVar9._0_8_ = 0x4330000000000000;
      dVar18 = SUB168(auVar19 | auVar9,0) - 4503599627370496.0;
      auVar20._8_8_ = SUB168(auVar19 | auVar9,8) - 4503599627370496.0;
      auVar15._4_4_ = 0;
      auVar15._0_4_ = auVar1._8_4_;
      auVar15._8_4_ = auVar1._12_4_;
      auVar15._12_4_ = 0;
      auVar10._8_8_ = 0x4330000000000000;
      auVar10._0_8_ = 0x4330000000000000;
      dVar14 = SUB168(auVar15 | auVar10,0) - 4503599627370496.0;
      dVar17 = SUB168(auVar15 | auVar10,8) - 4503599627370496.0;
      auVar23._8_8_ = dVar18;
      auVar23._0_8_ = dVar14;
      auVar16._8_8_ = dVar43;
      auVar16._0_8_ = dVar17;
      auVar20._0_8_ = dVar40;
      auVar42._8_8_ = dVar28;
      auVar42._0_8_ = dVar33;
      dVar13 = local_38;
      if ((uVar4 != 0) && (dVar13 = (double)pDVar11->lookupDepthTotal / dVar33, dVar13 <= local_38))
      {
        dVar13 = local_38;
      }
      dVar24 = dVar24 + dVar40;
      dVar25 = dVar25 + auVar20._8_8_;
      dVar21 = dVar21 + dVar17;
      dVar22 = dVar22 + dVar43;
      dVar26 = dVar26 + dVar14;
      dVar27 = dVar27 + dVar18;
      dVar34 = dVar34 + dVar33;
      dVar35 = dVar35 + dVar28;
      auVar7._8_8_ = dVar45;
      auVar7._0_8_ = uVar44;
      in_XMM1 = maxpd(auVar20,auVar7);
      auVar6._8_8_ = uVar39;
      auVar6._0_8_ = uVar38;
      auVar19 = maxpd(auVar16,auVar6);
      auVar5._8_8_ = uVar37;
      auVar5._0_8_ = uVar36;
      auVar41 = maxpd(auVar23,auVar5);
      in_XMM11 = maxpd(auVar42,local_78);
      dVar45 = (double)pDVar11->maxLookupDepth;
      if ((double)pDVar11->maxLookupDepth <= dVar46) {
        dVar45 = dVar46;
      }
      dVar46 = dVar45;
      uVar36 = auVar41._0_8_;
      uVar37 = auVar41._8_8_;
      uVar38 = auVar19._0_8_;
      uVar39 = auVar19._8_8_;
      uVar44 = in_XMM1._0_8_;
      dVar45 = in_XMM1._8_8_;
      local_78 = in_XMM11;
      local_38 = dVar13;
    }
    in_XMM1._8_8_ = dVar45;
    in_XMM1._0_8_ = dVar45;
    if ((double)DAT_0144aaac <= dVar45) {
      in_XMM11._0_8_ = (double)pDVar12->instancesCount;
      Output::Print(L"%8s  %13.0f  %13.0f  %13.2f  %13.0f  %13.2f  %13.0f  %13.0f  %14.0f  %14.2f  %13.2f  %13.2f  %13d    %S\n"
                    ,dVar24 / in_XMM11._0_8_,dVar22 / in_XMM11._0_8_,dVar21 / in_XMM11._0_8_,
                    dVar27 / in_XMM11._0_8_,dVar25 / in_XMM11._0_8_,dVar26 / in_XMM11._0_8_,
                    dVar35 / in_XMM11._0_8_,dVar34 / in_XMM11._0_8_,L"AVG:",
                    (ulong)(uint)pDVar12->instancesCount,pDVar12->name);
      in_XMM1._8_8_ = uVar39;
      in_XMM1._0_8_ = (double)uVar39;
      Output::Print(L"%8s  %13.0f  %13.0f  %13.2f  %13.0f  %13.2f  %13.0f  %13.0f  %14.0f  %14.2f  %13.2f  %13.2f  %13d    %S\n\n"
                    ,uVar44,uVar39,uVar38,uVar37,dVar45,uVar36,local_78._8_8_,L"MAX:",
                    (ulong)(uint)pDVar12->instancesCount,pDVar12->name);
    }
  }
  Output::Print(
               L"====================================================================================\n"
               );
  ClearStats();
  CCLock::Leave(&dictionaryTypesCriticalSection.super_CCLock);
  return;
}

Assistant:

void DictionaryStats::OutputStats()
{
    if (!dictionaryTypes)
        return;

    DictionaryStats::dictionaryTypesCriticalSection.Enter();
    DictionaryType* current = dictionaryTypes;
    Output::Print(_u("PROFILE DICTIONARY\n"));
    Output::Print(_u("%8s  %13s  %13s  %13s  %13s  %13s  %13s  %13s  %14s  %14s  %13s  %13s  %13s    %s\n"), _u("Metric"),_u("StartSize"), _u("EndSize"), _u("Resizes"), _u("Items"), _u("MaxDepth"), _u("EmptyBuckets"), _u("Lookups"), _u("Collisions"), _u("AvgLookupDepth"), _u("AvgCollDepth"), _u("MaxLookupDepth"), _u("Instances"), _u("Type"));
    while(current)
    {
        DictionaryType *type = current;

        DictionaryStats *instance = type->instances;
        double size = 0, max_size = 0;
        double endSize = 0, max_endSize = 0;
        double resizes = 0, max_resizes = 0;
        double items = 0, max_items = 0;
        double depth = 0, max_depth = 0;
        double empty = 0, max_empty = 0;
        double lookups = 0, max_lookups = 0;
        double collisions = 0, max_collisions = 0;
        double avglookupdepth = 0, max_avglookupdepth = 0;
        double avgcollisiondepth = 0, max_avgcollisiondepth = 0;
        double maxlookupdepth = 0, max_maxlookupdepth = 0;

        bool dumpInstances = false;
        //if(strstr(type->name, "SimpleDictionaryPropertyDescriptor") != nullptr)
        //{
        //    dumpInstances = true;
        //}
        while(instance)
        {
            ComputeStats(instance->initialSize, size, max_size);
            ComputeStats(instance->finalSize, endSize, max_endSize);
            ComputeStats(instance->countOfResize, resizes, max_resizes);
            ComputeStats(instance->itemCount, items, max_items);
            ComputeStats(instance->maxDepth, depth, max_depth);
            ComputeStats(instance->countOfEmptyBuckets, empty, max_empty);
            ComputeStats(instance->lookupCount, lookups, max_lookups);
            ComputeStats(instance->collisionCount, collisions, max_collisions);
            if (instance->lookupCount > 0)
            {
                ComputeStats((double)instance->lookupDepthTotal / (double)instance->lookupCount, avglookupdepth, max_avglookupdepth);
            }
            if (instance->collisionCount > 0)
            {
                ComputeStats((double)instance->lookupDepthTotal / (double)instance->collisionCount, avgcollisiondepth, max_avgcollisiondepth);
            }
            ComputeStats(instance->maxLookupDepth, maxlookupdepth, max_maxlookupdepth);

            if(dumpInstances)
            {
                double avgld = 0.0;
                double avgcd = 0.0;
                if (instance->lookupCount > 0)
                {
                    avgld = (double)instance->lookupDepthTotal / (double)instance->lookupCount;
                    avgcd = (double)instance->lookupDepthTotal / (double)instance->collisionCount;
                }
                Output::Print(_u("%8s  %13d  %13d  %13d  %13d  %13d  %13d  %13d  %14d  %14.2f  %13.2f  %13d \n"),
                    _u("INS:"),
                    instance->initialSize, instance->finalSize, instance->countOfResize,
                    instance->itemCount, instance->maxDepth, instance->countOfEmptyBuckets,
                    instance->lookupCount, instance->collisionCount, avgld, avgcd,
                    instance->maxLookupDepth);
            }
            instance = instance->pNext;
        }

        if (max_depth >= Js::Configuration::Global.flags.ProfileDictionary)
        {
            Output::Print(_u("%8s  %13.0f  %13.0f  %13.2f  %13.0f  %13.2f  %13.0f  %13.0f  %14.0f  %14.2f  %13.2f  %13.2f  %13d    %S\n"), _u("AVG:"),
                size/type->instancesCount, endSize/type->instancesCount, resizes/type->instancesCount, items/type->instancesCount,
                depth/type->instancesCount, empty/type->instancesCount, lookups/type->instancesCount, collisions/type->instancesCount,
                avglookupdepth/type->instancesCount, avgcollisiondepth/type->instancesCount, maxlookupdepth/type->instancesCount, type->instancesCount, type->name);
            Output::Print(_u("%8s  %13.0f  %13.0f  %13.2f  %13.0f  %13.2f  %13.0f  %13.0f  %14.0f  %14.2f  %13.2f  %13.2f  %13d    %S\n\n"), _u("MAX:"),
                max_size, max_endSize, max_resizes, max_items, max_depth, max_empty, max_lookups, max_collisions, max_avglookupdepth,
                max_avgcollisiondepth, max_maxlookupdepth, type->instancesCount, type->name);

        }
        current = current->pNext;
    }
    Output::Print(_u("====================================================================================\n"));
    ClearStats();
    DictionaryStats::dictionaryTypesCriticalSection.Leave();
}